

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O3

int GuillotineBinPack::ScoreByHeuristic
              (int width,int height,Rect *freeRect,FreeRectChoiceHeuristic rectChoice)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  switch(rectChoice) {
  case RectBestAreaFit:
    return freeRect->height * freeRect->width - height * width;
  case RectBestShortSideFit:
    uVar2 = freeRect->width - width;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar3 = freeRect->height - height;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    if (uVar1 < uVar2) {
      uVar2 = uVar1;
    }
    return uVar2;
  case RectBestLongSideFit:
    uVar2 = freeRect->width - width;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar3 = freeRect->height - height;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
    return uVar2;
  case RectWorstAreaFit:
    return height * width - freeRect->height * freeRect->width;
  case RectWorstShortSideFit:
    uVar2 = freeRect->width - width;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar3 = freeRect->height - height;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    if (uVar1 < uVar2) {
      uVar2 = uVar1;
    }
    break;
  case RectWorstLongSideFit:
    uVar2 = freeRect->width - width;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar3 = freeRect->height - height;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/GuillotineBinPack.cpp"
                  ,0x185,
                  "static int GuillotineBinPack::ScoreByHeuristic(int, int, const Rect &, FreeRectChoiceHeuristic)"
                 );
  }
  return -uVar2;
}

Assistant:

int GuillotineBinPack::ScoreByHeuristic(int width, int height, const Rect &freeRect, FreeRectChoiceHeuristic rectChoice)
{
	switch(rectChoice)
	{
	case RectBestAreaFit: return ScoreBestAreaFit(width, height, freeRect);
	case RectBestShortSideFit: return ScoreBestShortSideFit(width, height, freeRect);
	case RectBestLongSideFit: return ScoreBestLongSideFit(width, height, freeRect);
	case RectWorstAreaFit: return ScoreWorstAreaFit(width, height, freeRect);
	case RectWorstShortSideFit: return ScoreWorstShortSideFit(width, height, freeRect);
	case RectWorstLongSideFit: return ScoreWorstLongSideFit(width, height, freeRect);
	default: assert(false); return INT_MAX;
	}
}